

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hpp
# Opt level: O2

void __thiscall
duckdb::roaring::ArrayContainerScanState<true>::ScanPartial
          (ArrayContainerScanState<true> *this,Vector *result,idx_t result_offset,idx_t to_scan)

{
  ulong uVar1;
  ulong uVar2;
  
  FlatVector::VerifyFlatVector(result);
  if (this->array_index == 0) {
    (*(this->super_ContainerScanState)._vptr_ContainerScanState[5])(this);
  }
  while ((uVar1 = (this->super_ContainerScanState).scanned_count, this->finished != true &&
         (uVar2 = (ulong)this->value, uVar2 < uVar1 + to_scan))) {
    if (uVar1 <= uVar2) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                 (result_offset - uVar1) + uVar2);
    }
    (*(this->super_ContainerScanState)._vptr_ContainerScanState[5])(this);
  }
  (this->super_ContainerScanState).scanned_count = uVar1 + to_scan;
  return;
}

Assistant:

void ScanPartial(Vector &result, idx_t result_offset, idx_t to_scan) override {
		auto &result_mask = FlatVector::Validity(result);

		// This method assumes that the validity mask starts off as having all bits set for the entries that are being
		// scanned.

		if (!INVERTED) {
			// If we are mapping valid entries, that means the majority of the bits are invalid
			// so we set everything to invalid and only flip the bits that are present in the array
			SetInvalidRange(result_mask, result_offset, result_offset + to_scan);
		}

		if (!array_index) {
			LoadNextValue();
		}
		// At least one of the entries to scan is set
		while (!finished) {
			if (value >= scanned_count + to_scan) {
				break;
			}
			if (value < scanned_count) {
				LoadNextValue();
				continue;
			}
			auto index = value - scanned_count;
			if (INVERTED) {
				result_mask.SetInvalid(result_offset + index);
			} else {
				result_mask.SetValid(result_offset + index);
			}
			LoadNextValue();
		}
		scanned_count += to_scan;
	}